

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O1

void bssl::dtls_clear_unused_write_epochs(SSL *ssl)

{
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *this;
  char *pcVar1;
  byte bVar2;
  DTLS1_STATE *pDVar3;
  DTLS1_STATE *pDVar4;
  pointer __p;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *__it;
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *__it_00;
  ulong uVar8;
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *pIVar9;
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *pIVar10;
  ulong new_size;
  SSL *local_40;
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *local_38;
  
  pDVar3 = ssl->d1;
  this = &pDVar3->extra_write_epochs;
  bVar2 = (pDVar3->extra_write_epochs).size_;
  uVar8 = (ulong)bVar2;
  pIVar9 = (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *)
           ((pDVar3->extra_write_epochs).storage_ + uVar8 * 8);
  __it = this;
  local_40 = ssl;
  if (3 < bVar2) {
    local_38 = (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *
               )(this->storage_ + (ulong)(bVar2 & 0xfffffffc) * 8);
    lVar7 = (ulong)(bVar2 >> 2) + 1;
    __it_00 = this;
    do {
      bVar6 = __gnu_cxx::__ops::_Iter_pred<bssl::dtls_clear_unused_write_epochs(ssl_st*)::$_0>::
              operator()((_Iter_pred<bssl::dtls_clear_unused_write_epochs(ssl_st*)::__0> *)&local_40
                         ,(unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *)__it_00);
      pIVar10 = __it_00;
      if (bVar6) goto LAB_00170d49;
      bVar6 = __gnu_cxx::__ops::_Iter_pred<bssl::dtls_clear_unused_write_epochs(ssl_st*)::$_0>::
              operator()((_Iter_pred<bssl::dtls_clear_unused_write_epochs(ssl_st*)::__0> *)&local_40
                         ,(unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *)
                          ((__uniq_ptr_data<bssl::DTLSWriteEpoch,_bssl::internal::Deleter,_true,_true>
                            *)__it_00->storage_ + 1));
      pIVar10 = (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                 *)((__uniq_ptr_data<bssl::DTLSWriteEpoch,_bssl::internal::Deleter,_true,_true> *)
                    __it_00->storage_ + 1);
      if (bVar6) goto LAB_00170d49;
      bVar6 = __gnu_cxx::__ops::_Iter_pred<bssl::dtls_clear_unused_write_epochs(ssl_st*)::$_0>::
              operator()((_Iter_pred<bssl::dtls_clear_unused_write_epochs(ssl_st*)::__0> *)&local_40
                         ,(unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *)
                          &__it_00->size_);
      pIVar10 = (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                 *)&__it_00->size_;
      if (bVar6) goto LAB_00170d49;
      bVar6 = __gnu_cxx::__ops::_Iter_pred<bssl::dtls_clear_unused_write_epochs(ssl_st*)::$_0>::
              operator()((_Iter_pred<bssl::dtls_clear_unused_write_epochs(ssl_st*)::__0> *)&local_40
                         ,(unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *)(__it_00 + 1)
                        );
      pIVar10 = __it_00 + 1;
      if (bVar6) goto LAB_00170d49;
      __it_00 = (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                 *)((UniquePtr<DTLSIncomingMessage> *)(__it_00 + 1) + 1);
      lVar7 = lVar7 + -1;
      __it = local_38;
    } while (1 < lVar7);
  }
  lVar7 = (long)pIVar9 - (long)__it >> 3;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pIVar10 = pIVar9;
      if ((lVar7 != 3) ||
         (bVar6 = __gnu_cxx::__ops::_Iter_pred<bssl::dtls_clear_unused_write_epochs(ssl_st*)::$_0>::
                  operator()((_Iter_pred<bssl::dtls_clear_unused_write_epochs(ssl_st*)::__0> *)
                             &local_40,
                             (unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *)__it),
         pIVar10 = __it, bVar6)) goto LAB_00170d49;
      __it = (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *)
             ((__uniq_ptr_data<bssl::DTLSWriteEpoch,_bssl::internal::Deleter,_true,_true> *)
              __it->storage_ + 1);
    }
    bVar6 = __gnu_cxx::__ops::_Iter_pred<bssl::dtls_clear_unused_write_epochs(ssl_st*)::$_0>::
            operator()((_Iter_pred<bssl::dtls_clear_unused_write_epochs(ssl_st*)::__0> *)&local_40,
                       (unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *)__it);
    pIVar10 = __it;
    if (bVar6) goto LAB_00170d49;
    __it = (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *)
           ((__uniq_ptr_data<bssl::DTLSWriteEpoch,_bssl::internal::Deleter,_true,_true> *)
            __it->storage_ + 1);
  }
  bVar6 = __gnu_cxx::__ops::_Iter_pred<bssl::dtls_clear_unused_write_epochs(ssl_st*)::$_0>::
          operator()((_Iter_pred<bssl::dtls_clear_unused_write_epochs(ssl_st*)::__0> *)&local_40,
                     (unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *)__it);
  pIVar10 = __it;
  if (!bVar6) {
    pIVar10 = pIVar9;
  }
LAB_00170d49:
  if (pIVar10 == pIVar9) {
    return;
  }
  new_size = (long)pIVar10 - (long)this >> 3;
  uVar5 = new_size;
  do {
    if (uVar8 <= uVar5 + 1) {
      InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::Shrink
                (this,new_size);
      return;
    }
    pDVar4 = ssl->d1;
    bVar2 = (pDVar4->outgoing_messages).size_;
    bVar6 = bVar2 == 0;
    if (!bVar6) {
      lVar7 = 0;
      bVar6 = false;
      do {
        if ((*(short *)((pDVar4->outgoing_messages).storage_ + lVar7 + 0x10) ==
             *(short *)(*(long *)(this->storage_ + uVar5 * 8 + 8) + 6)) &&
           (((pDVar4->outgoing_messages).storage_[lVar7 + 0x12] != '\0' ||
            (*(long *)((pDVar4->outgoing_messages).storage_ + lVar7 + 0x20) != 0)))) break;
        lVar7 = lVar7 + 0x30;
        bVar6 = (ulong)bVar2 * 0x30 == lVar7;
      } while (!bVar6);
    }
    if (!bVar6) {
      if (uVar8 <= new_size) {
        abort();
      }
      __p = *(pointer *)(this->storage_ + uVar5 * 8 + 8);
      pcVar1 = this->storage_ + uVar5 * 8 + 8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      std::__uniq_ptr_impl<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *)
                 (this->storage_ + new_size * 8),__p);
      new_size = new_size + 1;
    }
    uVar8 = (ulong)(pDVar3->extra_write_epochs).size_;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void dtls_clear_unused_write_epochs(SSL *ssl) {
  ssl->d1->extra_write_epochs.EraseIf(
      [ssl](const UniquePtr<DTLSWriteEpoch> &write_epoch) -> bool {
        // Non-current epochs may be discarded once there are no incomplete
        // outgoing messages that reference them.
        //
        // TODO(crbug.com/42290594): Epoch 1 (0-RTT) should be retained until
        // epoch 3 (app data) is available.
        for (const auto &msg : ssl->d1->outgoing_messages) {
          if (msg.epoch == write_epoch->epoch() && !msg.IsFullyAcked()) {
            return false;
          }
        }
        return true;
      });
}